

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp_write_nonblock.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  uint __i;
  in_addr_t iVar2;
  uint uVar3;
  int __fd;
  int iVar4;
  FILE *__stream;
  long lVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  time_t tVar9;
  long lVar10;
  ulong uVar11;
  time_t tVar12;
  size_t sVar13;
  fd_set *__writefds;
  fd_set *__readfds;
  char *pcVar14;
  long lVar15;
  size_t sStack_191a0;
  int iStack_19188;
  timeval timeout;
  sockaddr_in sin;
  fd_set fd;
  stat fileinfo;
  char mem [102400];
  
  iVar2 = 0x100007f;
  if ((1 < argc) && (iVar2 = inet_addr(argv[1]), argc != 2)) {
    username = argv[2];
    if ((3 < (uint)argc) &&
       ((password = argv[3], argc != 4 && (loclfile = argv[4], 5 < (uint)argc)))) {
      scppath = argv[5];
    }
  }
  uVar3 = libssh2_init(0);
  if (uVar3 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar3);
    return 1;
  }
  __stream = fopen(loclfile,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Cannot open local file %s\n",loclfile);
    return 1;
  }
  stat(loclfile,(stat *)&fileinfo);
  __fd = socket(2,1,0);
  if (__fd == -1) {
    fwrite("failed to create socket.\n",0x19,1,_stderr);
    goto LAB_00101884;
  }
  sin.sin_family = 2;
  sin.sin_port = 0x1600;
  sin.sin_addr.s_addr = iVar2;
  iVar4 = connect(__fd,(sockaddr *)&sin,0x10);
  if (iVar4 == 0) {
    lVar5 = libssh2_session_init_ex(0,0,0,0);
    if (lVar5 != 0) {
      libssh2_session_set_blocking(lVar5,0);
      do {
        uVar3 = libssh2_session_handshake(lVar5,__fd);
      } while (uVar3 == 0xffffffdb);
      if (uVar3 == 0) {
        lVar6 = libssh2_hostkey_hash(lVar5,2);
        fwrite("Fingerprint: ",0xd,1,_stderr);
        for (lVar15 = 0; lVar15 != 0x14; lVar15 = lVar15 + 1) {
          fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar6 + lVar15));
        }
        fputc(10,_stderr);
        do {
          pcVar14 = username;
          sVar7 = strlen(username);
          pcVar1 = password;
          sVar8 = strlen(password);
          iVar4 = libssh2_userauth_password_ex
                            (lVar5,pcVar14,sVar7 & 0xffffffff,pcVar1,sVar8 & 0xffffffff,0);
        } while (iVar4 == -0x25);
        if (iVar4 == 0) {
LAB_001015a3:
          lVar6 = libssh2_scp_send_ex(lVar5,scppath,fileinfo.st_mode & 0x1ff,fileinfo.st_size,0,0);
          if (lVar6 == 0) goto code_r0x001015c2;
          fwrite("SCP session waiting to send file\n",0x21,1,_stderr);
          tVar9 = time((time_t *)0x0);
          lVar15 = 0;
          while( true ) {
            pcVar14 = mem;
            sVar7 = fread(pcVar14,1,0x19000,__stream);
            if (sVar7 == 0) break;
            lVar15 = lVar15 + sVar7;
            sVar8 = 0;
            do {
              while (lVar10 = libssh2_channel_write_ex(lVar6,0,pcVar14,sVar7), lVar10 == -0x25) {
                timeout.tv_sec = 10;
                timeout.tv_usec = 0;
                for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
                  fd.__fds_bits[lVar10] = 0;
                }
                fd.__fds_bits[__fd / 0x40] = fd.__fds_bits[__fd / 0x40] | 1L << ((byte)__fd & 0x3f);
                uVar11 = libssh2_session_block_directions(lVar5);
                __readfds = &fd;
                if ((uVar11 & 1) == 0) {
                  __readfds = (fd_set *)0x0;
                }
                __writefds = &fd;
                if ((uVar11 & 2) == 0) {
                  __writefds = (fd_set *)0x0;
                }
                select(__fd + 1,(fd_set *)__readfds,(fd_set *)__writefds,(fd_set *)0x0,
                       (timeval *)&timeout);
                sVar8 = 0;
              }
              if (lVar10 < 0) {
                fprintf(_stderr,"ERROR %ld total %ld / %lu prev %lu\n",lVar10,lVar15,sVar7,sVar8);
                goto LAB_0010179f;
              }
              pcVar14 = pcVar14 + lVar10;
              sVar13 = sVar7 - lVar10;
              sVar8 = sVar7;
              sVar7 = sVar13;
            } while (sVar13 != 0);
          }
LAB_0010179f:
          tVar12 = time((time_t *)0x0);
          iStack_19188 = (int)tVar9;
          uVar3 = (int)tVar12 - iStack_19188;
          fprintf(_stderr,"%ld bytes in %d seconds makes %.1f bytes/sec\n",
                  (double)lVar15 / (double)(int)uVar3,lVar15,(ulong)uVar3);
          fwrite("Sending EOF\n",0xc,1,_stderr);
          do {
            iVar4 = libssh2_channel_send_eof(lVar6);
          } while (iVar4 == -0x25);
          fwrite("Waiting for EOF\n",0x10,1,_stderr);
          do {
            iVar4 = libssh2_channel_wait_eof(lVar6);
          } while (iVar4 == -0x25);
          fwrite("Waiting for channel to close\n",0x1d,1,_stderr);
          do {
            iVar4 = libssh2_channel_wait_closed(lVar6);
          } while (iVar4 == -0x25);
          libssh2_channel_free(lVar6);
          goto LAB_00101854;
        }
        fwrite("Authentication by password failed.\n",0x23,1,_stderr);
      }
      else {
        fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar3);
      }
      goto LAB_00101854;
    }
    pcVar14 = "Could not initialize SSH session.\n";
    sStack_191a0 = 0x22;
  }
  else {
    pcVar14 = "failed to connect.\n";
    sStack_191a0 = 0x13;
  }
  fwrite(pcVar14,sStack_191a0,1,_stderr);
LAB_00101871:
  shutdown(__fd,2);
  close(__fd);
LAB_00101884:
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return 0;
code_r0x001015c2:
  iVar4 = libssh2_session_last_errno(lVar5);
  if (iVar4 != -0x25) goto code_r0x001015cf;
  goto LAB_001015a3;
code_r0x001015cf:
  libssh2_session_last_error(lVar5,mem,0,0);
  fprintf(_stderr,"%s\n",mem._0_8_);
LAB_00101854:
  do {
    iVar4 = libssh2_session_disconnect_ex(lVar5,0xb,"Normal Shutdown","");
  } while (iVar4 == -0x25);
  libssh2_session_free(lVar5);
  goto LAB_00101871;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    FILE *local;
    char mem[1024 * 100];
    size_t nread;
    char *ptr;
    struct stat fileinfo;
    time_t start;
    libssh2_struct_stat_size total = 0;
    int duration;
    size_t prev;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        loclfile = argv[4];
    }
    if(argc > 5) {
        scppath = argv[5];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    local = fopen(loclfile, "rb");
    if(!local) {
        fprintf(stderr, "Cannot open local file %s\n", loclfile);
        return 1;
    }

    stat(loclfile, &fileinfo);

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* Since we have set non-blocking, tell libssh2 we are non-blocking */
    libssh2_session_set_blocking(session, 0);

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    while((rc = libssh2_session_handshake(session, sock)) ==
          LIBSSH2_ERROR_EAGAIN);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        while((rc = libssh2_userauth_password(session, username, password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by password failed.\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        while((rc = libssh2_userauth_publickey_fromfile(session, username,
                                                        pubkey, privkey,
                                                        password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by public key failed.\n");
            goto shutdown;
        }
    }

    /* Send a file via scp. The mode parameter must only have permissions! */
    do {
        channel = libssh2_scp_send(session, scppath, fileinfo.st_mode & 0777,
                                   (size_t)fileinfo.st_size);

        if(!channel &&
           libssh2_session_last_errno(session) != LIBSSH2_ERROR_EAGAIN) {
            char *err_msg;

            libssh2_session_last_error(session, &err_msg, NULL, 0);
            fprintf(stderr, "%s\n", err_msg);
            goto shutdown;
        }
    } while(!channel);

    fprintf(stderr, "SCP session waiting to send file\n");
    start = time(NULL);
    do {
        nread = fread(mem, 1, sizeof(mem), local);
        if(nread <= 0) {
            /* end of file */
            break;
        }
        ptr = mem;

        total += (libssh2_struct_stat_size)nread;

        prev = 0;
        do {
            ssize_t nwritten;
            while((nwritten = libssh2_channel_write(channel, ptr, nread)) ==
                  LIBSSH2_ERROR_EAGAIN) {
                waitsocket(sock, session);
                prev = 0;
            }
            if(nwritten < 0) {
                fprintf(stderr, "ERROR %ld total %ld / %lu prev %lu\n",
                        (long)nwritten, (long)total,
                        (unsigned long)nread, (unsigned long)prev);
                break;
            }
            else {
                prev = nread;

                /* nwritten indicates how many bytes were written this time */
                ptr += nwritten;
                nread -= (size_t)nwritten;
            }
        } while(nread);
    } while(!nread); /* only continue if nread was drained */

    duration = (int)(time(NULL) - start);

    fprintf(stderr, "%ld bytes in %d seconds makes %.1f bytes/sec\n",
           (long)total, duration, (double)total / duration);

    fprintf(stderr, "Sending EOF\n");
    while(libssh2_channel_send_eof(channel) == LIBSSH2_ERROR_EAGAIN);

    fprintf(stderr, "Waiting for EOF\n");
    while(libssh2_channel_wait_eof(channel) == LIBSSH2_ERROR_EAGAIN);

    fprintf(stderr, "Waiting for channel to close\n");
    while(libssh2_channel_wait_closed(channel) == LIBSSH2_ERROR_EAGAIN);

    libssh2_channel_free(channel);
    channel = NULL;

shutdown:

    if(session) {
        while(libssh2_session_disconnect(session, "Normal Shutdown") ==
              LIBSSH2_ERROR_EAGAIN);
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}